

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  size_t len_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || ((buf->flags & 3) != 0)) {
    buf_local = (xmlBufPtr)0x0;
  }
  else if (len == 0) {
    buf_local = (xmlBufPtr)0x0;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->use < len) {
      buf_local = (xmlBufPtr)0x0;
    }
    else {
      buf->use = buf->use - len;
      buf->content = buf->content + len;
      buf->size = buf->size - len;
      if (buf->size < 0x7fffffff) {
        buf->compat_size = (uint)buf->size;
      }
      else {
        buf->compat_size = 0x7fffffff;
      }
      buf_local = (xmlBufPtr)len;
      if (buf->use < 0x7fffffff) {
        buf->compat_use = (uint)buf->use;
      }
      else {
        buf->compat_use = 0x7fffffff;
      }
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)))
        return(0);
    if (len == 0)
        return(0);
    CHECK_COMPAT(buf)

    if (len > buf->use)
        return(0);

    buf->use -= len;
    buf->content += len;
    buf->size -= len;

    UPDATE_COMPAT(buf)
    return(len);
}